

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O0

realtype N_VDotProd_SensWrapper(N_Vector x,N_Vector y)

{
  realtype rVar1;
  double local_28;
  realtype sum;
  int i;
  N_Vector y_local;
  N_Vector x_local;
  
  local_28 = 0.0;
  for (sum._4_4_ = 0; sum._4_4_ < *(int *)((long)x->content + 8); sum._4_4_ = sum._4_4_ + 1) {
    rVar1 = N_VDotProd(*(N_Vector *)(*x->content + (long)sum._4_4_ * 8),
                       *(N_Vector *)(*y->content + (long)sum._4_4_ * 8));
    local_28 = rVar1 + local_28;
  }
  return local_28;
}

Assistant:

realtype N_VDotProd_SensWrapper(N_Vector x, N_Vector y)
{
  int i;
  realtype sum;

  sum = ZERO;

  for (i=0; i < NV_NVECS_SW(x); i++)
    sum += N_VDotProd(NV_VEC_SW(x,i), NV_VEC_SW(y,i));

  return(sum);
}